

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

void duckdb_je_extent_dalloc_wrapper(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,edata_t *edata)

{
  extent_hooks_t *peVar1;
  bool bVar2;
  byte bVar3;
  _Bool _Var4;
  uint64_t uVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((extent_hooks_t *)(ehooks->ptr).repr == &duckdb_je_ehooks_default_extent_hooks) {
    if (!duckdb_je_opt_retain) {
LAB_01f9a905:
      if ((edata->e_bits & 0x10000) != 0) {
        duckdb_je_san_unguard_pages(tsdn,ehooks,edata,pac->emap,true,true);
      }
      extent_deregister(tsdn,pac,edata);
      pvVar6 = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
      edata->e_addr = pvVar6;
      uVar8 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
      uVar7 = edata->e_bits;
      peVar1 = (extent_hooks_t *)(ehooks->ptr).repr;
      if (peVar1 == &duckdb_je_ehooks_default_extent_hooks) {
        bVar2 = duckdb_je_ehooks_default_dalloc_impl(pvVar6,uVar8);
joined_r0x01f9a9aa:
        if (!bVar2) {
          duckdb_je_edata_cache_put(tsdn,pac->edata_cache,edata);
          return;
        }
      }
      else if (peVar1->dalloc != (extent_dalloc_t *)0x0) {
        ehooks_pre_reentrancy(tsdn);
        bVar2 = (*peVar1->dalloc)(peVar1,pvVar6,uVar8,(_Bool)((byte)(uVar7 >> 0xd) & 1),ehooks->ind)
        ;
        ehooks_post_reentrancy(tsdn);
        goto joined_r0x01f9a9aa;
      }
      extent_register(tsdn,pac,edata);
    }
  }
  else if (*(long *)((long)(ehooks->ptr).repr + 8) != 0) goto LAB_01f9a905;
  uVar5 = edata->e_bits;
  uVar7 = 0x8000;
  if (((uint)uVar5 >> 0xd & 1) == 0) goto LAB_01f9ab08;
  uVar8 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
  pvVar6 = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
  peVar1 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar1 == &duckdb_je_ehooks_default_extent_hooks) {
    bVar3 = duckdb_je_ehooks_default_decommit_impl(pvVar6,0,uVar8);
LAB_01f9aa60:
    uVar5 = (ulong)((byte)(edata->e_bits >> 0xd) & 1 & bVar3) << 0xd |
            edata->e_bits & 0xffffffffffffdfff;
    edata->e_bits = uVar5;
    if (bVar3 == 0) goto LAB_01f9ab08;
  }
  else if (peVar1->decommit != (undefined1 *)0x0) {
    ehooks_pre_reentrancy(tsdn);
    bVar3 = (*(code *)peVar1->decommit)(peVar1,pvVar6,uVar8,0,uVar8,ehooks->ind);
    ehooks_post_reentrancy(tsdn);
    goto LAB_01f9aa60;
  }
  uVar8 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
  _Var4 = ehooks_purge_forced(tsdn,ehooks,(void *)((ulong)edata->e_addr & 0xfffffffffffff000),uVar8,
                              0,uVar8);
  uVar5 = edata->e_bits;
  if (_Var4) {
    if (((uint)uVar5 & 0xe0000) == 0x40000) {
      uVar7 = 0;
    }
    else {
      uVar8 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
      uVar7 = 0;
      ehooks_purge_lazy(tsdn,ehooks,(void *)((ulong)edata->e_addr & 0xfffffffffffff000),uVar8,0,
                        uVar8);
      uVar5 = edata->e_bits;
    }
  }
LAB_01f9ab08:
  edata->e_bits = uVar5 & 0xffffffffffff7fff | uVar7;
  duckdb_je_extent_record(tsdn,pac,ehooks,&pac->ecache_retained,edata);
  return;
}

Assistant:

void
extent_dalloc_wrapper(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    edata_t *edata) {
	assert(edata_pai_get(edata) == EXTENT_PAI_PAC);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	/* Avoid calling the default extent_dalloc unless have to. */
	if (!ehooks_dalloc_will_fail(ehooks)) {
		/* Remove guard pages for dalloc / unmap. */
		if (edata_guarded_get(edata)) {
			assert(ehooks_are_default(ehooks));
			san_unguard_pages_two_sided(tsdn, ehooks, edata,
			    pac->emap);
		}
		/*
		 * Deregister first to avoid a race with other allocating
		 * threads, and reregister if deallocation fails.
		 */
		extent_deregister(tsdn, pac, edata);
		if (!extent_dalloc_wrapper_try(tsdn, pac, ehooks, edata)) {
			return;
		}
		extent_reregister(tsdn, pac, edata);
	}

	/* Try to decommit; purge if that fails. */
	bool zeroed;
	if (!edata_committed_get(edata)) {
		zeroed = true;
	} else if (!extent_decommit_wrapper(tsdn, ehooks, edata, 0,
	    edata_size_get(edata))) {
		zeroed = true;
	} else if (!ehooks_purge_forced(tsdn, ehooks, edata_base_get(edata),
	    edata_size_get(edata), 0, edata_size_get(edata))) {
		zeroed = true;
	} else if (edata_state_get(edata) == extent_state_muzzy ||
	    !ehooks_purge_lazy(tsdn, ehooks, edata_base_get(edata),
	    edata_size_get(edata), 0, edata_size_get(edata))) {
		zeroed = false;
	} else {
		zeroed = false;
	}
	edata_zeroed_set(edata, zeroed);

	if (config_prof) {
		extent_gdump_sub(tsdn, edata);
	}

	extent_record(tsdn, pac, ehooks, &pac->ecache_retained, edata);
}